

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyVisitor.hpp
# Opt level: O0

void __thiscall OpenMD::RBCOMVisitor::~RBCOMVisitor(RBCOMVisitor *this)

{
  void *in_RDI;
  
  ~RBCOMVisitor((RBCOMVisitor *)0x352c98);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

RBCOMVisitor(SimInfo* info) : BaseRigidBodyVisitor(info) {
      visitorName = "RBCOMVisitor";
    }